

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O1

void av1_fwd_txfm2d_4x16_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  ulong *puVar1;
  int32_t *piVar2;
  int32_t *piVar3;
  int32_t *piVar4;
  byte bVar5;
  code *pcVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int32_t iVar67;
  int32_t iVar68;
  int32_t iVar69;
  int32_t iVar70;
  int32_t iVar71;
  int32_t iVar72;
  int32_t iVar73;
  int32_t iVar74;
  int32_t iVar75;
  int32_t iVar76;
  uint uVar77;
  long lVar78;
  undefined7 in_register_00000009;
  long lVar79;
  int iVar80;
  uint uVar81;
  ulong *puVar82;
  ulong *puVar83;
  int i;
  ulong *puVar84;
  int iVar85;
  ulong uVar86;
  bool bVar87;
  int iVar88;
  int iVar92;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 in_XMM1 [16];
  undefined1 in_XMM2 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar93 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar94 [16];
  __m128i tmp [4];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined8 local_88;
  int iStack_80;
  int iStack_7c;
  undefined8 local_78 [2];
  int32_t aiStack_68 [14];
  
  uVar86 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  bVar87 = 0xf < tx_type;
  uVar81 = 0xbeaf >> (tx_type & 0x1f);
  uVar77 = 0x7f1f >> (tx_type & 0x1f);
  local_88 = av1_fwd_txfm_shift_ls[0xd];
  iVar80 = (int)*av1_fwd_txfm_shift_ls[0xd];
  puVar82 = (ulong *)(input + stride * 8);
  lVar79 = (long)stride;
  bVar7 = (uVar81 & 1) != 0;
  puVar83 = puVar82;
  puVar1 = (ulong *)input;
  if (bVar7 || bVar87) {
    puVar83 = (ulong *)input;
    puVar1 = puVar82;
  }
  puVar83 = (ulong *)((long)puVar83 + (long)(stride * 4) * 2);
  if (bVar7 || bVar87) {
    local_188._0_8_ = *(undefined8 *)input;
    local_178._0_8_ = *(undefined8 *)(input + lVar79);
    local_168._0_8_ = *(undefined8 *)(input + stride * 2);
    puVar84 = (ulong *)(input + stride * 3);
  }
  else {
    local_188._0_8_ = *(ulong *)((long)puVar83 + (long)(stride * 3) * 2);
    local_178._0_8_ = *(ulong *)((long)puVar83 + (long)(stride * 2) * 2);
    local_168._0_8_ = *(ulong *)((long)puVar83 + lVar79 * 2);
    puVar84 = puVar83;
    puVar83 = puVar82;
  }
  local_168._8_8_ = 0;
  local_178._8_8_ = 0;
  local_188._8_8_ = 0;
  pcVar6 = *(code **)((long)row_highbd_txfm4x4_arr + uVar86);
  local_158._0_8_ = *puVar84;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = local_158._0_8_;
  if ((uVar77 & 1) == 0 && !bVar87) {
    auVar90 = pshuflw(auVar89,local_188,0x1b);
    local_188._0_8_ = auVar90._0_8_;
    auVar90 = pshuflw(auVar90,local_178,0x1b);
    local_178._0_8_ = auVar90._0_8_;
    auVar90 = pshuflw(auVar90,local_168,0x1b);
    local_168._0_8_ = auVar90._0_8_;
    auVar89 = pshuflw(auVar90,auVar89,0x1b);
    local_158._0_8_ = auVar89._0_8_;
  }
  auVar89 = pmovsxwd(in_XMM1,local_188._0_8_);
  auVar90 = pmovsxwd(in_XMM2,local_178._0_8_);
  auVar93 = pmovsxwd(in_XMM3,local_168._0_8_);
  auVar94 = pmovsxwd(in_XMM4,local_158._0_8_);
  local_188._4_4_ = auVar89._4_4_;
  local_188._0_4_ = auVar89._0_4_ << iVar80;
  local_188._8_4_ = auVar89._8_4_;
  local_188._12_4_ = auVar89._12_4_;
  local_178._0_4_ = auVar90._0_4_ << iVar80;
  local_178._4_4_ = auVar90._4_4_;
  local_178._8_4_ = auVar90._8_4_;
  local_178._12_4_ = auVar90._12_4_;
  local_168._0_4_ = auVar93._0_4_ << iVar80;
  local_168._4_4_ = auVar93._4_4_;
  local_168._8_4_ = auVar93._8_4_;
  local_168._12_4_ = auVar93._12_4_;
  local_158._0_4_ = auVar94._0_4_ << iVar80;
  local_158._4_4_ = auVar94._4_4_;
  local_158._8_4_ = auVar94._8_4_;
  local_158._12_4_ = auVar94._12_4_;
  if ((uVar81 & 1) == 0 && !bVar87) {
    local_148._0_8_ = *(ulong *)((long)puVar83 + (long)(stride * 3) * 2);
    local_138._0_8_ = *(ulong *)((long)puVar83 + (long)(stride * 2) * 2);
    local_128._0_8_ = *(ulong *)((long)puVar83 + lVar79 * 2);
  }
  else {
    local_148._0_8_ = *puVar83;
    local_138._0_8_ = *(ulong *)((long)puVar83 + lVar79 * 2);
    local_128._0_8_ = *(ulong *)((long)puVar83 + (long)(stride * 2) * 2);
    puVar83 = (ulong *)((long)puVar83 + (long)(stride * 3) * 2);
  }
  local_128._8_8_ = 0;
  local_138._8_8_ = 0;
  local_148._8_8_ = 0;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *puVar83;
  if ((uVar77 & 1) == 0 && !bVar87) {
    auVar89 = pshuflw(auVar90,local_148,0x1b);
    local_148._0_8_ = auVar89._0_8_;
    auVar89 = pshuflw(auVar89,local_138,0x1b);
    local_138._0_8_ = auVar89._0_8_;
    auVar89 = pshuflw(auVar89,local_128,0x1b);
    local_128._0_8_ = auVar89._0_8_;
    auVar90 = pshuflw(auVar89,auVar90,0x1b);
  }
  auVar89 = pmovsxwd(auVar90,local_148._0_8_);
  auVar93 = pmovsxwd(local_178,local_138._0_8_);
  auVar94 = pmovsxwd(local_168,local_128._0_8_);
  local_118._0_8_ = auVar90._0_8_;
  auVar90 = pmovsxwd(local_158,local_118._0_8_);
  local_148._4_4_ = auVar89._4_4_;
  local_148._0_4_ = auVar89._0_4_ << iVar80;
  local_148._8_4_ = auVar89._8_4_;
  local_148._12_4_ = auVar89._12_4_;
  local_138._0_4_ = auVar93._0_4_ << iVar80;
  local_138._4_4_ = auVar93._4_4_;
  local_138._8_4_ = auVar93._8_4_;
  local_138._12_4_ = auVar93._12_4_;
  local_128._0_4_ = auVar94._0_4_ << iVar80;
  local_128._4_4_ = auVar94._4_4_;
  local_128._8_4_ = auVar94._8_4_;
  local_128._12_4_ = auVar94._12_4_;
  local_118._0_4_ = auVar90._0_4_ << iVar80;
  local_118._4_4_ = auVar90._4_4_;
  local_118._8_4_ = auVar90._8_4_;
  local_118._12_4_ = auVar90._12_4_;
  puVar1 = (ulong *)((long)puVar1 + (long)(stride * 4) * 2);
  if ((uVar81 & 1) != 0 || bVar87) {
    local_108._0_8_ = *puVar82;
    local_f8._0_8_ = *(ulong *)((long)puVar82 + lVar79 * 2);
    local_e8._0_8_ = *(ulong *)((long)puVar82 + (long)(stride * 2) * 2);
    puVar82 = (ulong *)((long)puVar82 + (long)(stride * 3) * 2);
    input = (int16_t *)puVar1;
  }
  else {
    local_108._0_8_ = *(ulong *)((long)puVar1 + (long)(stride * 3) * 2);
    local_f8._0_8_ = *(ulong *)((long)puVar1 + (long)(stride * 2) * 2);
    local_e8._0_8_ = *(ulong *)((long)puVar1 + lVar79 * 2);
    puVar82 = puVar1;
  }
  local_e8._8_8_ = 0;
  local_f8._8_8_ = 0;
  local_108._8_8_ = 0;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *puVar82;
  if ((uVar77 & 1) == 0 && !bVar87) {
    auVar89 = pshuflw(auVar93,local_108,0x1b);
    local_108._0_8_ = auVar89._0_8_;
    auVar89 = pshuflw(auVar89,local_f8,0x1b);
    local_f8._0_8_ = auVar89._0_8_;
    auVar89 = pshuflw(auVar89,local_e8,0x1b);
    local_e8._0_8_ = auVar89._0_8_;
    auVar93 = pshuflw(auVar89,auVar93,0x1b);
  }
  auVar89 = pmovsxwd(auVar93,local_108._0_8_);
  auVar90 = pmovsxwd(local_138,local_f8._0_8_);
  auVar94 = pmovsxwd(local_128,local_e8._0_8_);
  local_d8._0_8_ = auVar93._0_8_;
  auVar93 = pmovsxwd(local_118,local_d8._0_8_);
  local_108._4_4_ = auVar89._4_4_;
  local_108._0_4_ = auVar89._0_4_ << iVar80;
  local_108._8_4_ = auVar89._8_4_;
  local_108._12_4_ = auVar89._12_4_;
  local_f8._0_4_ = auVar90._0_4_ << iVar80;
  local_f8._4_4_ = auVar90._4_4_;
  local_f8._8_4_ = auVar90._8_4_;
  local_f8._12_4_ = auVar90._12_4_;
  local_e8._0_4_ = auVar94._0_4_ << iVar80;
  local_e8._4_4_ = auVar94._4_4_;
  local_e8._8_4_ = auVar94._8_4_;
  local_e8._12_4_ = auVar94._12_4_;
  local_d8._0_4_ = auVar93._0_4_ << iVar80;
  local_d8._4_4_ = auVar93._4_4_;
  local_d8._8_4_ = auVar93._8_4_;
  local_d8._12_4_ = auVar93._12_4_;
  if ((uVar81 & 1) == 0 && !bVar87) {
    local_c8._0_8_ = *(ulong *)((long)input + (long)(stride * 3) * 2);
    local_b8._0_8_ = *(ulong *)((long)input + (long)(stride * 2) * 2);
    local_a8._0_8_ = *(ulong *)((long)input + lVar79 * 2);
  }
  else {
    local_c8._0_8_ = *(undefined8 *)input;
    local_b8._0_8_ = *(ulong *)((long)input + lVar79 * 2);
    local_a8._0_8_ = *(ulong *)((long)input + (long)(stride * 2) * 2);
    input = (int16_t *)((long)input + (long)(stride * 3) * 2);
  }
  local_a8._8_8_ = 0;
  local_b8._8_8_ = 0;
  local_c8._8_8_ = 0;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)input;
  if ((uVar77 & 1) == 0 && !bVar87) {
    auVar89 = pshuflw(auVar94,local_c8,0x1b);
    local_c8._0_8_ = auVar89._0_8_;
    auVar89 = pshuflw(auVar89,local_b8,0x1b);
    local_b8._0_8_ = auVar89._0_8_;
    auVar89 = pshuflw(auVar89,local_a8,0x1b);
    local_a8._0_8_ = auVar89._0_8_;
    auVar94 = pshuflw(auVar89,auVar94,0x1b);
  }
  auVar89 = pmovsxwd(auVar94,local_c8._0_8_);
  auVar90 = pmovsxwd(local_f8,local_b8._0_8_);
  auVar93 = pmovsxwd(local_e8,local_a8._0_8_);
  local_98 = auVar94._0_8_;
  auVar94 = pmovsxwd(local_d8,local_98);
  local_c8._4_4_ = auVar89._4_4_;
  local_c8._0_4_ = auVar89._0_4_ << iVar80;
  local_c8._8_4_ = auVar89._8_4_;
  local_c8._12_4_ = auVar89._12_4_;
  local_b8._4_4_ = auVar90._4_4_;
  local_b8._0_4_ = auVar90._0_4_ << iVar80;
  local_b8._8_4_ = auVar90._8_4_;
  local_b8._12_4_ = auVar90._12_4_;
  local_a8._4_4_ = auVar93._4_4_;
  local_a8._0_4_ = auVar93._0_4_ << iVar80;
  local_a8._8_4_ = auVar93._8_4_;
  local_a8._12_4_ = auVar93._12_4_;
  local_98._4_4_ = auVar94._4_4_;
  local_98._0_4_ = auVar94._0_4_ << iVar80;
  uStack_90 = auVar94._8_4_;
  uStack_8c = auVar94._12_4_;
  (**(code **)((long)col_highbd_txfm8x16_arr + uVar86))(local_188,coeff,0xd,1);
  bVar5 = local_88[1];
  iVar85 = 1 << (~bVar5 & 0x1f);
  iVar80 = *coeff;
  iVar8 = coeff[1];
  iVar9 = coeff[2];
  iVar10 = coeff[3];
  *coeff = iVar80 + iVar85;
  coeff[1] = iVar8 + iVar85;
  coeff[2] = iVar9 + iVar85;
  coeff[3] = iVar10 + iVar85;
  iVar11 = coeff[4];
  iVar12 = coeff[5];
  iVar13 = coeff[6];
  iVar14 = coeff[7];
  coeff[4] = iVar11 + iVar85;
  coeff[5] = iVar12 + iVar85;
  coeff[6] = iVar13 + iVar85;
  coeff[7] = iVar14 + iVar85;
  iVar15 = coeff[8];
  iVar16 = coeff[9];
  iVar17 = coeff[10];
  iVar18 = coeff[0xb];
  coeff[8] = iVar15 + iVar85;
  coeff[9] = iVar16 + iVar85;
  coeff[10] = iVar17 + iVar85;
  coeff[0xb] = iVar18 + iVar85;
  iVar88 = coeff[0xc] + iVar85;
  iVar92 = coeff[0xd] + iVar85;
  iStack_80 = coeff[0xe] + iVar85;
  iStack_7c = coeff[0xf] + iVar85;
  local_88 = (int8_t *)CONCAT44(iVar92,iVar88);
  coeff[0xc] = iVar88;
  coeff[0xd] = iVar92;
  coeff[0xe] = iStack_80;
  coeff[0xf] = iStack_7c;
  iVar19 = coeff[0x10];
  iVar20 = coeff[0x11];
  iVar21 = coeff[0x12];
  iVar22 = coeff[0x13];
  coeff[0x10] = iVar19 + iVar85;
  coeff[0x11] = iVar20 + iVar85;
  coeff[0x12] = iVar21 + iVar85;
  coeff[0x13] = iVar22 + iVar85;
  iVar23 = coeff[0x14];
  iVar24 = coeff[0x15];
  iVar25 = coeff[0x16];
  iVar26 = coeff[0x17];
  coeff[0x14] = iVar23 + iVar85;
  coeff[0x15] = iVar24 + iVar85;
  coeff[0x16] = iVar25 + iVar85;
  coeff[0x17] = iVar26 + iVar85;
  iVar27 = coeff[0x18];
  iVar28 = coeff[0x19];
  iVar29 = coeff[0x1a];
  iVar30 = coeff[0x1b];
  coeff[0x18] = iVar27 + iVar85;
  coeff[0x19] = iVar28 + iVar85;
  coeff[0x1a] = iVar29 + iVar85;
  coeff[0x1b] = iVar30 + iVar85;
  iVar31 = coeff[0x1c];
  iVar32 = coeff[0x1d];
  iVar33 = coeff[0x1e];
  iVar34 = coeff[0x1f];
  coeff[0x1c] = iVar31 + iVar85;
  coeff[0x1d] = iVar32 + iVar85;
  coeff[0x1e] = iVar33 + iVar85;
  coeff[0x1f] = iVar34 + iVar85;
  iVar35 = coeff[0x20];
  iVar36 = coeff[0x21];
  iVar37 = coeff[0x22];
  iVar38 = coeff[0x23];
  coeff[0x20] = iVar35 + iVar85;
  coeff[0x21] = iVar36 + iVar85;
  coeff[0x22] = iVar37 + iVar85;
  coeff[0x23] = iVar38 + iVar85;
  iVar39 = coeff[0x24];
  iVar40 = coeff[0x25];
  iVar41 = coeff[0x26];
  iVar42 = coeff[0x27];
  coeff[0x24] = iVar39 + iVar85;
  coeff[0x25] = iVar40 + iVar85;
  coeff[0x26] = iVar41 + iVar85;
  coeff[0x27] = iVar42 + iVar85;
  iVar43 = coeff[0x28];
  iVar44 = coeff[0x29];
  iVar45 = coeff[0x2a];
  iVar46 = coeff[0x2b];
  coeff[0x28] = iVar43 + iVar85;
  coeff[0x29] = iVar44 + iVar85;
  coeff[0x2a] = iVar45 + iVar85;
  coeff[0x2b] = iVar46 + iVar85;
  iVar47 = coeff[0x2c];
  iVar48 = coeff[0x2d];
  iVar49 = coeff[0x2e];
  iVar50 = coeff[0x2f];
  coeff[0x2c] = iVar47 + iVar85;
  coeff[0x2d] = iVar48 + iVar85;
  coeff[0x2e] = iVar49 + iVar85;
  coeff[0x2f] = iVar50 + iVar85;
  iVar51 = coeff[0x30];
  iVar52 = coeff[0x31];
  iVar53 = coeff[0x32];
  iVar54 = coeff[0x33];
  coeff[0x30] = iVar51 + iVar85;
  coeff[0x31] = iVar52 + iVar85;
  coeff[0x32] = iVar53 + iVar85;
  coeff[0x33] = iVar54 + iVar85;
  iVar55 = coeff[0x34];
  iVar56 = coeff[0x35];
  iVar57 = coeff[0x36];
  iVar58 = coeff[0x37];
  coeff[0x34] = iVar55 + iVar85;
  coeff[0x35] = iVar56 + iVar85;
  coeff[0x36] = iVar57 + iVar85;
  coeff[0x37] = iVar58 + iVar85;
  iVar59 = coeff[0x38];
  iVar60 = coeff[0x39];
  iVar61 = coeff[0x3a];
  iVar62 = coeff[0x3b];
  coeff[0x38] = iVar59 + iVar85;
  coeff[0x39] = iVar60 + iVar85;
  coeff[0x3a] = iVar61 + iVar85;
  coeff[0x3b] = iVar62 + iVar85;
  iVar63 = coeff[0x3c];
  iVar64 = coeff[0x3d];
  iVar65 = coeff[0x3e];
  iVar66 = coeff[0x3f];
  auVar89 = ZEXT416((uint)-(int)(char)bVar5);
  coeff[0x3c] = iVar85 + iVar63;
  coeff[0x3d] = iVar85 + iVar64;
  coeff[0x3e] = iVar85 + iVar65;
  coeff[0x3f] = iVar85 + iVar66;
  *coeff = iVar80 + iVar85 >> auVar89;
  coeff[1] = iVar8 + iVar85 >> auVar89;
  coeff[2] = iVar9 + iVar85 >> auVar89;
  coeff[3] = iVar10 + iVar85 >> auVar89;
  coeff[4] = iVar11 + iVar85 >> auVar89;
  coeff[5] = iVar12 + iVar85 >> auVar89;
  coeff[6] = iVar13 + iVar85 >> auVar89;
  coeff[7] = iVar14 + iVar85 >> auVar89;
  coeff[8] = iVar15 + iVar85 >> auVar89;
  coeff[9] = iVar16 + iVar85 >> auVar89;
  coeff[10] = iVar17 + iVar85 >> auVar89;
  coeff[0xb] = iVar18 + iVar85 >> auVar89;
  coeff[0xc] = iVar88 >> auVar89;
  coeff[0xd] = iVar92 >> auVar89;
  coeff[0xe] = iStack_80 >> auVar89;
  coeff[0xf] = iStack_7c >> auVar89;
  coeff[0x10] = iVar19 + iVar85 >> auVar89;
  coeff[0x11] = iVar20 + iVar85 >> auVar89;
  coeff[0x12] = iVar21 + iVar85 >> auVar89;
  coeff[0x13] = iVar22 + iVar85 >> auVar89;
  coeff[0x14] = iVar23 + iVar85 >> auVar89;
  coeff[0x15] = iVar24 + iVar85 >> auVar89;
  coeff[0x16] = iVar25 + iVar85 >> auVar89;
  coeff[0x17] = iVar26 + iVar85 >> auVar89;
  coeff[0x18] = iVar27 + iVar85 >> auVar89;
  coeff[0x19] = iVar28 + iVar85 >> auVar89;
  coeff[0x1a] = iVar29 + iVar85 >> auVar89;
  coeff[0x1b] = iVar30 + iVar85 >> auVar89;
  coeff[0x1c] = iVar31 + iVar85 >> auVar89;
  coeff[0x1d] = iVar32 + iVar85 >> auVar89;
  coeff[0x1e] = iVar33 + iVar85 >> auVar89;
  coeff[0x1f] = iVar34 + iVar85 >> auVar89;
  coeff[0x20] = iVar35 + iVar85 >> auVar89;
  coeff[0x21] = iVar36 + iVar85 >> auVar89;
  coeff[0x22] = iVar37 + iVar85 >> auVar89;
  coeff[0x23] = iVar38 + iVar85 >> auVar89;
  coeff[0x24] = iVar39 + iVar85 >> auVar89;
  coeff[0x25] = iVar40 + iVar85 >> auVar89;
  coeff[0x26] = iVar41 + iVar85 >> auVar89;
  coeff[0x27] = iVar42 + iVar85 >> auVar89;
  coeff[0x28] = iVar43 + iVar85 >> auVar89;
  coeff[0x29] = iVar44 + iVar85 >> auVar89;
  coeff[0x2a] = iVar45 + iVar85 >> auVar89;
  coeff[0x2b] = iVar46 + iVar85 >> auVar89;
  coeff[0x2c] = iVar47 + iVar85 >> auVar89;
  coeff[0x2d] = iVar48 + iVar85 >> auVar89;
  coeff[0x2e] = iVar49 + iVar85 >> auVar89;
  coeff[0x2f] = iVar50 + iVar85 >> auVar89;
  coeff[0x30] = iVar51 + iVar85 >> auVar89;
  coeff[0x31] = iVar52 + iVar85 >> auVar89;
  coeff[0x32] = iVar53 + iVar85 >> auVar89;
  coeff[0x33] = iVar54 + iVar85 >> auVar89;
  coeff[0x34] = iVar55 + iVar85 >> auVar89;
  coeff[0x35] = iVar56 + iVar85 >> auVar89;
  coeff[0x36] = iVar57 + iVar85 >> auVar89;
  coeff[0x37] = iVar58 + iVar85 >> auVar89;
  coeff[0x38] = iVar59 + iVar85 >> auVar89;
  coeff[0x39] = iVar60 + iVar85 >> auVar89;
  coeff[0x3a] = iVar61 + iVar85 >> auVar89;
  coeff[0x3b] = iVar62 + iVar85 >> auVar89;
  coeff[0x3c] = iVar85 + iVar63 >> auVar89;
  coeff[0x3d] = iVar85 + iVar64 >> auVar89;
  coeff[0x3e] = iVar85 + iVar65 >> auVar89;
  coeff[0x3f] = iVar85 + iVar66 >> auVar89;
  lVar79 = 0;
  do {
    piVar2 = coeff + lVar79;
    iVar72 = piVar2[1];
    piVar3 = coeff + lVar79 + 4;
    iVar67 = piVar3[1];
    piVar4 = coeff + lVar79 + 8;
    iVar73 = *piVar4;
    iVar74 = piVar4[1];
    iVar75 = piVar4[2];
    iVar76 = piVar4[3];
    piVar4 = coeff + lVar79 + 0xc;
    iVar68 = *piVar4;
    iVar69 = piVar4[1];
    iVar70 = piVar4[2];
    iVar71 = piVar4[3];
    auVar91._0_8_ = CONCAT44(piVar3[2],piVar2[2]);
    auVar91._8_4_ = piVar2[3];
    auVar91._12_4_ = piVar3[3];
    *(ulong *)(local_188 + lVar79) = CONCAT44(*piVar3,*piVar2);
    *(ulong *)(local_188 + lVar79 + 8) = CONCAT44(iVar68,iVar73);
    *(int32_t *)(local_148 + lVar79 + 8) = iVar72;
    *(int32_t *)(local_148 + lVar79 + 0xc) = iVar67;
    *(int32_t *)(local_138 + lVar79) = iVar74;
    *(int32_t *)(local_138 + lVar79 + 4) = iVar69;
    *(undefined8 *)(local_108 + lVar79) = auVar91._0_8_;
    *(int32_t *)(local_108 + lVar79 + 8) = iVar75;
    *(int32_t *)(local_108 + lVar79 + 0xc) = iVar70;
    *(long *)(local_c8 + lVar79) = auVar91._8_8_;
    *(int32_t *)(local_b8 + lVar79) = iVar76;
    *(int32_t *)(local_b8 + lVar79 + 4) = iVar71;
    lVar79 = lVar79 + 0x10;
  } while (lVar79 != 0x40);
  lVar79 = 0;
  do {
    (*pcVar6)(local_188 + lVar79 * 0x10,local_78,0xc,4);
    lVar78 = 0;
    do {
      iVar67 = *(int32_t *)((long)aiStack_68 + lVar78);
      iVar68 = *(int32_t *)((long)aiStack_68 + lVar78 + 4);
      piVar2 = coeff + lVar78;
      *(undefined8 *)piVar2 = *(undefined8 *)((long)local_78 + lVar78);
      piVar2[4] = iVar67;
      piVar2[5] = iVar68;
      lVar78 = lVar78 + 0x10;
    } while (lVar78 != 0x40);
    lVar79 = lVar79 + 1;
    coeff = coeff + 4;
  } while (lVar79 != 4);
  return;
}

Assistant:

void av1_fwd_txfm2d_4x16_sse4_1(const int16_t *input, int32_t *coeff,
                                int stride, TX_TYPE tx_type, int bd) {
  __m128i in[16];
  __m128i *outcoeff128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_4X16];
  const int txw_idx = get_txw_idx(TX_4X16);
  const int txh_idx = get_txh_idx(TX_4X16);
  const int txfm_size_col = tx_size_wide[TX_4X16];
  const int txfm_size_row = tx_size_high[TX_4X16];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const fwd_transform_1d_sse4_1 col_txfm = col_highbd_txfm8x16_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = row_highbd_txfm4x4_arr[tx_type];

  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  // col transform
  load_buffer_4x16(input, in, stride, ud_flip, lr_flip, shift[0]);
  col_txfm(in, outcoeff128, bitcol, 1);
  col_txfm_8x8_rounding(outcoeff128, -shift[1]);
  transpose_8nx8n(outcoeff128, in, txfm_size_col, txfm_size_row);

  // row transform
  for (int i = 0; i < 4; i++) {
    __m128i tmp[4];
    row_txfm(in + i, tmp, bitrow, txfm_size_row >> 2);
    store_output_w4(coeff + i * 4, tmp, txfm_size_row, txfm_size_col);
  }
  (void)bd;
}